

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8Wrap.c
# Opt level: O0

XFontStruct * find_best_font(Display *dpy,char **name)

{
  char *pcVar1;
  Display *pDVar2;
  XFontStruct *s;
  undefined8 *puStack_28;
  int cnt;
  char **list;
  char **name_local;
  Display *dpy_local;
  
  list = name;
  name_local = (char **)dpy;
  puStack_28 = (undefined8 *)XListFonts(dpy,*name,1,(long)&s + 4);
  if ((s._4_4_ == 0) || (puStack_28 == (undefined8 *)0x0)) {
    dpy_local = (Display *)0x0;
  }
  else {
    free(*list);
    pcVar1 = strdup((char *)*puStack_28);
    *list = pcVar1;
    pDVar2 = (Display *)XLoadQueryFont(name_local,*list);
    XFreeFontNames(puStack_28);
    dpy_local = pDVar2;
  }
  return (XFontStruct *)dpy_local;
}

Assistant:

static XFontStruct *
find_best_font(Display  *dpy,
	       char     **name) {

  char **list;
  int cnt;
  XFontStruct *s;

  list = XListFonts(dpy, *name, 1, &cnt);
  if (cnt && list) {
    free(*name);
    *name = strdup(list[0]);
    s = XLoadQueryFont(dpy, *name);
    XFreeFontNames(list);
    return s;
  }
  return NULL;
}